

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# command_line_interface_unittest.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::anon_unknown_0::CommandLineInterfaceTest_FeatureExtensions_Test::
TestBody(CommandLineInterfaceTest_FeatureExtensions_Test *this)

{
  Descriptor *this_00;
  FileDescriptor *this_01;
  allocator<char> local_c1;
  string local_c0;
  string_view local_a0;
  string_view local_90;
  string_view local_80;
  string_view local_70 [2];
  string local_50;
  string_view local_30;
  string_view local_20;
  CommandLineInterfaceTest_FeatureExtensions_Test *local_10;
  CommandLineInterfaceTest_FeatureExtensions_Test *this_local;
  
  local_10 = this;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (&local_20,"google/protobuf/descriptor.proto");
  this_00 = DescriptorProto::descriptor();
  this_01 = Descriptor::file(this_00);
  FileDescriptor::DebugString_abi_cxx11_(&local_50,this_01);
  local_30 = (string_view)
             std::__cxx11::string::operator_cast_to_basic_string_view((string *)&local_50);
  CommandLineInterfaceTester::CreateTempFile((CommandLineInterfaceTester *)this,local_20,local_30);
  std::__cxx11::string::~string((string *)&local_50);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (local_70,"features.proto");
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (&local_80,
             "\n    syntax = \"proto2\";\n    package pb;\n    import \"google/protobuf/descriptor.proto\";\n    extend google.protobuf.FeatureSet {\n      optional TestFeatures test = 9999;\n    }\n    message TestFeatures {\n      optional int32 int_feature = 1 [\n        retention = RETENTION_RUNTIME,\n        targets = TARGET_TYPE_FIELD,\n        edition_defaults = { edition: EDITION_2023, value: \"3\" }\n      ];\n    }"
            );
  CommandLineInterfaceTester::CreateTempFile
            ((CommandLineInterfaceTester *)this,local_70[0],local_80);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_90,"foo.proto");
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (&local_a0,
             "\n    edition = \"2023\";\n    import \"features.proto\";\n    message Foo {\n      int32 bar = 1;\n      int32 baz = 2 [features.(pb.test).int_feature = 5];\n    }"
            );
  CommandLineInterfaceTester::CreateTempFile((CommandLineInterfaceTester *)this,local_90,local_a0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_c0,
             "protocol_compiler --proto_path=$tmpdir --test_out=$tmpdir foo.proto",&local_c1);
  CommandLineInterfaceTest::Run(&this->super_CommandLineInterfaceTest,&local_c0);
  std::__cxx11::string::~string((string *)&local_c0);
  std::allocator<char>::~allocator(&local_c1);
  CommandLineInterfaceTester::ExpectNoErrors((CommandLineInterfaceTester *)this);
  return;
}

Assistant:

TEST_F(CommandLineInterfaceTest, FeatureExtensions) {
  CreateTempFile("google/protobuf/descriptor.proto",
                 google::protobuf::DescriptorProto::descriptor()->file()->DebugString());
  CreateTempFile("features.proto",
                 R"schema(
    syntax = "proto2";
    package pb;
    import "google/protobuf/descriptor.proto";
    extend google.protobuf.FeatureSet {
      optional TestFeatures test = 9999;
    }
    message TestFeatures {
      optional int32 int_feature = 1 [
        retention = RETENTION_RUNTIME,
        targets = TARGET_TYPE_FIELD,
        edition_defaults = { edition: EDITION_2023, value: "3" }
      ];
    })schema");
  CreateTempFile("foo.proto",
                 R"schema(
    edition = "2023";
    import "features.proto";
    message Foo {
      int32 bar = 1;
      int32 baz = 2 [features.(pb.test).int_feature = 5];
    })schema");

  Run("protocol_compiler --proto_path=$tmpdir --test_out=$tmpdir foo.proto");
  ExpectNoErrors();
}